

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlen.c
# Opt level: O3

int vflen(char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  byte *in_RAX;
  size_t sVar2;
  ulong uVar3;
  int *piVar4;
  byte bVar5;
  int iVar6;
  undefined8 *puVar7;
  double *pdVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  bool bVar15;
  bool bVar16;
  double dVar17;
  char *endp;
  byte *local_38;
  
  iVar10 = 0;
  local_38 = in_RAX;
LAB_00136cc7:
  pbVar14 = (byte *)fmt;
  if (*fmt == 0x25) {
    do {
      fmt = (char *)(pbVar14 + 1);
      bVar5 = *fmt;
      if (bVar5 < 0x2b) {
        if (bVar5 == 0x20) goto LAB_00136ce9;
        iVar6 = 2;
        if (bVar5 != 0x23) goto LAB_00136d0b;
      }
      else {
        if ((bVar5 != 0x2d) && (bVar5 != 0x2b)) goto LAB_00136d0b;
LAB_00136ce9:
        iVar6 = 1;
      }
      iVar10 = iVar10 + iVar6;
      pbVar14 = (byte *)fmt;
    } while( true );
  }
  iVar10 = iVar10 + 1;
  if (*fmt == 0) {
    return iVar10;
  }
  goto switchD_00136e37_caseD_62;
LAB_00136d0b:
  sVar2 = strtol(fmt,(char **)&local_38,10);
  pbVar13 = local_38;
  if ((byte *)fmt == local_38) {
    bVar5 = *fmt;
    if (bVar5 == 0x2a) {
      uVar1 = ap->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar4 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        piVar4 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar4 + 2;
      }
      sVar2 = (size_t)*piVar4;
      pbVar13 = pbVar14 + 2;
      goto LAB_00136d64;
    }
    sVar2 = 0;
  }
  else {
LAB_00136d64:
    bVar5 = *pbVar13;
    fmt = (char *)pbVar13;
  }
  if (bVar5 == 0x2e) {
    pbVar14 = (byte *)fmt + 1;
    uVar3 = strtol((char *)pbVar14,(char **)&local_38,10);
    pbVar13 = local_38;
    if ((local_38 == pbVar14) && (pbVar13 = pbVar14, *pbVar14 == 0x2a)) {
      uVar1 = ap->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar4 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        piVar4 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar4 + 2;
      }
      uVar3 = (ulong)*piVar4;
      pbVar13 = (byte *)fmt + 2;
    }
    uVar12 = uVar3;
    if ((long)uVar3 < (long)sVar2) {
      uVar12 = sVar2;
    }
    bVar5 = *pbVar13;
    fmt = (char *)pbVar13;
  }
  else {
    uVar3 = 0;
    uVar12 = sVar2;
  }
  lVar11 = 1;
  if (bVar5 == 0x68) {
LAB_00136df9:
    bVar5 = ((byte *)fmt)[lVar11];
    fmt = (char *)((byte *)fmt + lVar11);
  }
  else if (bVar5 == 0x6c) {
    bVar5 = ((byte *)fmt)[1];
    lVar11 = 2;
    if (bVar5 == 0x6c) goto LAB_00136df9;
    fmt = (char *)((byte *)fmt + 1);
  }
  if (bVar5 < 0x58) {
    if (bVar5 != 0x25) {
      if ((bVar5 != 0x45) && (bVar5 != 0x47)) goto switchD_00136e37_caseD_62;
      goto switchD_00136e37_caseD_65;
    }
    if ((long)sVar2 < 2) {
      sVar2 = 1;
    }
    goto LAB_00136fd3;
  }
  switch(bVar5) {
  case 0x62:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto switchD_00136e37_caseD_62;
  case 99:
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar4 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      piVar4 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar4 + 2;
    }
    if (*piVar4 < 0x80) {
      sVar2 = sVar2 + (sVar2 == 0);
    }
    else {
      sVar9 = __ctype_get_mb_cur_max();
      if (sVar2 <= sVar9) {
        sVar2 = __ctype_get_mb_cur_max();
      }
    }
    goto LAB_00136fd3;
  case 0x65:
  case 0x67:
switchD_00136e37_caseD_65:
    if (ap->fp_offset < 0xa1) {
      ap->fp_offset = ap->fp_offset + 0x10;
    }
    else {
      ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
    }
    bVar16 = SBORROW8(uVar12,0xe);
    bVar15 = (long)(uVar12 - 0xe) < 0;
    uVar3 = 0xd;
    break;
  case 0x66:
    uVar1 = ap->fp_offset;
    if ((ulong)uVar1 < 0xa1) {
      pdVar8 = (double *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->fp_offset = uVar1 + 0x10;
    }
    else {
      pdVar8 = (double *)ap->overflow_arg_area;
      ap->overflow_arg_area = pdVar8 + 1;
    }
    dVar17 = *pdVar8;
    if (dVar17 <= -dVar17) {
      dVar17 = -dVar17;
    }
    sVar9 = 0xf;
    if (1000000.0 < dVar17) {
      sVar9 = 0x13d;
    }
    sVar2 = sVar2 + 2;
    if ((long)sVar2 < (long)sVar9) {
      sVar2 = sVar9;
    }
    iVar6 = (int)uVar3 + -6;
    if (uVar3 == 0) {
      iVar6 = 0;
    }
    iVar10 = iVar10 + iVar6;
LAB_00136fd3:
    iVar10 = iVar10 + (int)sVar2;
    goto switchD_00136e37_caseD_62;
  case 0x70:
    if (ap->gp_offset < 0x29) {
      ap->gp_offset = ap->gp_offset + 8;
    }
    else {
      ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
    }
    bVar16 = SBORROW8(uVar12,0x15);
    bVar15 = (long)(uVar12 - 0x15) < 0;
    uVar3 = 0x14;
    break;
  case 0x73:
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar7 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar7 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar7 + 1;
    }
    if (uVar3 == 0) {
      sVar2 = strlen((char *)*puVar7);
      if ((long)uVar12 <= (long)(int)sVar2) {
        uVar12 = (long)(int)sVar2;
      }
    }
    goto LAB_00136e9a;
  default:
    if (bVar5 != 0x58) goto switchD_00136e37_caseD_62;
  case 0x61:
  case 100:
  case 0x69:
  case 0x75:
  case 0x78:
    if (ap->gp_offset < 0x29) {
      ap->gp_offset = ap->gp_offset + 8;
    }
    else {
      ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
    }
    bVar16 = SBORROW8(uVar12,0x18);
    bVar15 = (long)(uVar12 - 0x18) < 0;
    uVar3 = 0x17;
  }
  if (bVar16 != bVar15) {
    uVar12 = uVar3;
  }
LAB_00136e9a:
  iVar10 = iVar10 + (int)uVar12;
switchD_00136e37_caseD_62:
  fmt = (char *)((byte *)fmt + 1);
  goto LAB_00136cc7;
}

Assistant:

int vflen(char *fmt, va_list ap)
{
    int len = 0;
    char *cp, c;
    long long l;
    int i;
    double d; 

    /*
     * This code modifies 'ap', but we do not know if va_list is a structure
     * or a pointer to an array so we do not know if it is a local variable
     * or not.
     * C99 gets around this by defining va_copy() to make copies of ap, but
     * this does not exist on all systems.
     * For now, I just assume that when va_list is a pointer the system also
     * provides a va_copy macro to work around this problem. The only system
     * I have seen needing this so far was Linux on AMD64.
     */
#if defined(HAVE_VA_COPY)
    va_list ap_local;
    va_copy(ap_local, ap);
#    define ap ap_local
#endif

    for(cp = fmt; *cp; cp++) {
	switch(*cp) {

	/* A format specifier */
	case '%': {
	    char *endp;
	    long conv_len1=0, conv_len2=0, conv_len=0;
	    signed int arg_size;

	    /* Firstly, strip the modifier flags (+-#0 and [space]) */
	    for(; (c=*++cp);) {
		if ('#' == c)
		    len+=2; /* Worst case of "0x" */
		else if ('-' == c || '+' == c || ' ' == c)
		    len++;
		else
		    break;
	    }

	    /* Width specifier */
	    l = strtol(cp, &endp, 10);
	    if (endp != cp) {
		cp = endp;
		conv_len = conv_len1 = l;
	    } else if (*cp == '*') {
		conv_len = conv_len1 = (int)va_arg(ap, int);
		cp++;
	    }

	    /* Precision specifier */
	    if ('.' == *cp) {
		cp++;
		conv_len2 = strtol(cp, &endp, 10);
		if (endp != cp) {
		    cp = endp;
		} else if (*cp == '*') {
		    conv_len2 = (int)va_arg(ap, int);
		    cp++;
		}
		conv_len = MAX(conv_len1, conv_len2);
	    }

	    /* Short/long identifier */
	    if ('h' == *cp) {
		arg_size = -1; /* short */
		cp++;
	    } else if ('l' == *cp) {
		arg_size = 1; /* long */
		cp++;
		if ('l' == *cp) {
		    arg_size = 2; /* long long */
		    cp++;
		}
	    } else {
		arg_size = 0; /* int */
	    }

	    /* The actual type */
	    switch (*cp) {
	    case '%':
		/*
		 * Not real ANSI I suspect, but we'll allow for the
		 * completely daft "%10%" example.
		 */
		len += MAX(conv_len1, 1);
		break;

	    case 'd':
	    case 'i':
	    case 'u':
	    case 'a':
	    case 'x':
	    case 'X':
		/* Remember: char and short are sent as int on the stack */
		if (arg_size == -1)
		    l = (long)va_arg(ap, int);
		else if (arg_size == 1)
		    l = va_arg(ap, long); 
		else if (arg_size == 2)
		    l = va_arg(ap, long long); 
		else 
		    l = (long)va_arg(ap, int);

		DEBUG_printf("%d", l);

		/*
		 * No number can be more than 24 characters so we'll take
		 * the max of conv_len and 24 (23 is len(2^64) in octal).
		 * All that work above and we then go and estimate ;-),
		 * but it's needed incase someone does %500d.
		 */
		len += MAX(conv_len, 23);
		break;

	    case 'c':
		i = va_arg(ap, int);
		DEBUG_printf("%c", i);
		/*
		 * Note that %10c and %.10c act differently.
		 * Besides, I think precision is not really allowed for %c.
		 */
		len += MAX(conv_len1, i>=0x80 ?MB_CUR_MAX :1);
		break;

	    case 'f':
		d = va_arg(ap, double);
		DEBUG_printf("%f", d);
		/*
		 * Maybe "Inf" or "NaN", but we'll not worry about that.
		 * Again, err on side of caution and take max of conv_len
		 * and max length of a double. The worst case I can
		 * think of is 317 characters (-1[308 zeros].000000)
		 * without using precision codes. That's horrid. I
		 * cheat and either use 317 or 15 depending on how
		 * large the number is as I reckon 99% of floats
		 * aren't that long.
		 */
		l = (ABS(d) > 1000000) ? 317 : 15;
		l = MAX(l, conv_len1 + 2);
		if (conv_len2) l += conv_len2 - 6;
		len += l;
		break;

	    case 'e':
	    case 'E':
	    case 'g':
	    case 'G':
		d = va_arg(ap, double);
		DEBUG_printf("%g", d);
		/*
		 * Maybe "Inf" or "NaN", but we'll not worry about that
		 * Again, err on side of caution and take max of conv_len
		 * and max length of a double (which defaults to only
		 * '-' + 6 + '.' + 'E[+-]xxx' == 13.
		 */
		len += MAX(conv_len, 13);
		break;

	    case 'p':
		l = (long)va_arg(ap, void *);
		/*
		 * Max pointer is 64bits == 16 chars (on alpha),
		 * == 20 with + "0x".
		 */
		DEBUG_printf("%p", (void *)l);
		len += MAX(conv_len, 20);
		break;

	    case 'n':
		/* produces no output */
		break;

	    case 's': {
		char *s = (char *)va_arg(ap, char *);
		DEBUG_printf("%s", s);

		if (!conv_len2) {
		    len += MAX(conv_len, (int)strlen(s));
		} else {
		    len += conv_len;
		}
		break;
	    }

	    default:
		/* wchar_t types of 'C' and 'S' aren't supported */
		DEBUG_printf("Arg is %c\n", *cp);
	    }
	    
	}

	case '\0':
	    break;

	default:
	    DEBUG_printf("%c", *cp);
	    len++;
	}
    }

    va_end(ap);

    return len+1; /* one for the null character */
}